

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

boolean inherits(monst *shkp,int numsk,int croaked)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  long amount;
  bool bVar13;
  char takes [256];
  
  cVar2 = u.ushops[0];
  if (numsk < 2) {
    if (u.ushops[0] == (char)shkp[0x1b].meating) {
      iVar5 = inhishop(shkp);
      if (((((iVar5 == 0) || (*(short *)((long)&shkp[0x1b].misc_worn_check + 2) != 0)) ||
           (iVar5._0_1_ = shkp[0x1b].mtame, iVar5._1_1_ = shkp[0x1b].m_ap_type,
           iVar5._2_1_ = shkp[0x1b].mfrozen, iVar5._3_1_ = shkp[0x1b].mblinded, iVar5 != 0)) ||
          ((*(int *)&shkp[0x1b].field_0x60 != 0 || ((shkp->field_0x62 & 0x40) == 0)))) ||
         (*(char *)((long)&shkp[0x1b].meating + 1) != '\0')) goto LAB_0022d400;
      if (invent != (obj *)0x0) {
        pline("%s gratefully inherits all your possessions.",
              (undefined1 *)((long)&shkp[0x1c].minvent + 5));
      }
      set_repo_loc((eshk *)&shkp->field_0x74);
    }
    else {
LAB_0022d400:
      if (((*(short *)((long)&shkp[0x1b].misc_worn_check + 2) == 0) &&
          (*(int *)&shkp[0x1b].field_0x60 == 0)) &&
         (iVar6._0_1_ = shkp[0x1b].mtame, iVar6._1_1_ = shkp[0x1b].m_ap_type,
         iVar6._2_1_ = shkp[0x1b].mfrozen, iVar6._3_1_ = shkp[0x1b].mblinded, iVar6 == 0)) {
        bVar3 = 0;
        amount = 0;
      }
      else {
        if (cVar2 == (char)shkp[0x1b].meating) {
          iVar5 = inhishop(shkp);
          if (iVar5 == 0) goto LAB_0022d449;
          lVar8 = addupbill(shkp);
          lVar8 = *(int *)&shkp[0x1b].field_0x60 + lVar8;
        }
        else {
LAB_0022d449:
          lVar8 = 0;
        }
        iVar1._0_1_ = shkp[0x1b].mtame;
        iVar1._1_1_ = shkp[0x1b].m_ap_type;
        iVar1._2_1_ = shkp[0x1b].mfrozen;
        iVar1._3_1_ = shkp[0x1b].mblinded;
        amount = (long)iVar1;
        if (iVar1 < lVar8) {
          amount = lVar8;
        }
        bVar3 = 1;
      }
      if ((*(char *)((long)&shkp[0x1b].meating + 1) != '\0') ||
         ((byte)(~bVar3 & (shkp->field_0x62 & 0x40) >> 6) == 0)) {
        if (invent == (obj *)0x0) {
          bVar13 = false;
        }
        else {
          lVar8 = money_cnt(invent);
          takes[0] = '\0';
          if ((*(uint *)&shkp->field_0x60 & 0xc0000) != 0x40000) {
            sVar9 = strlen(takes);
            builtin_strncpy(takes + sVar9,"wakes up and ",0xe);
          }
          iVar5 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy);
          if (2 < iVar5) {
            sVar9 = strlen(takes);
            builtin_strncpy(takes + sVar9,"comes and ",0xb);
          }
          sVar9 = strlen(takes);
          builtin_strncpy(takes + sVar9,"takes",6);
          if ((amount == 0 || lVar8 < amount) || (cVar2 == (char)shkp[0x1b].meating)) {
            iVar6 = *(int *)&shkp[0x1b].mtame - (int)lVar8;
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            shkp[0x1b].mtame = (char)iVar5;
            shkp[0x1b].m_ap_type = (char)((uint)iVar5 >> 8);
            shkp[0x1b].mfrozen = (char)((uint)iVar5 >> 0x10);
            shkp[0x1b].mblinded = (char)((uint)iVar5 >> 0x18);
            if (0 < lVar8) {
              money2mon(shkp,lVar8);
            }
            iflags.botl = '\x01';
            pline("%s %s all your possessions.",(undefined1 *)((long)&shkp[0x1c].minvent + 5),takes)
            ;
            set_repo_loc((eshk *)&shkp->field_0x74);
            bVar13 = true;
          }
          else {
            money2mon(shkp,amount);
            iflags.botl = '\x01';
            pcVar7 = Monnam(shkp);
            pcVar11 = currency(amount);
            iVar5 = strncmp(&shkp[0x1b].field_0x75,plname,0x20);
            pcVar12 = "";
            if (iVar5 == 0) {
              pcVar12 = "you ";
            }
            pcVar10 = "her";
            if ((shkp->field_0x60 & 1) == 0) {
              pcVar10 = "him";
            }
            bVar13 = false;
            pline("%s %s the %ld %s %sowed %s.",pcVar7,takes,amount,pcVar11,pcVar12,pcVar10);
            pacify_shk(shkp);
            *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
            shkp[0x1b].mtame = '\0';
            shkp[0x1b].m_ap_type = '\0';
            shkp[0x1b].mfrozen = '\0';
            shkp[0x1b].mblinded = '\0';
          }
        }
        goto LAB_0022d643;
      }
    }
    bVar13 = false;
  }
  else {
    if ((croaked != 0) && ((viz_array[shkp->my][shkp->mx] & 2U) != 0)) {
      pcVar7 = Monnam(shkp);
      pcVar12 = "";
      pcVar11 = "wakes up, ";
      if ((*(uint *)&shkp->field_0x60 >> 0x13 & 1) == 0) {
        pcVar11 = "";
      }
      if ((*(uint *)&shkp->field_0x60 >> 0x12 & 1) == 0) {
        pcVar11 = "wakes up, ";
      }
      uVar4 = mt_random();
      if (((uVar4 & 1) == 0) && (pcVar12 = ", shakes her head,", (shkp->field_0x60 & 1) == 0)) {
        pcVar12 = ", shakes his head,";
      }
      iVar5 = inhishop(shkp);
      pcVar10 = "sighs";
      if (iVar5 == 0) {
        pcVar10 = "disappears";
      }
      pline("%s %slooks at your corpse%s and %s.",pcVar7,pcVar11,pcVar12,pcVar10);
    }
    rouse_shk(shkp,'\0');
    bVar13 = cVar2 == (char)shkp[0x1b].meating;
LAB_0022d643:
    rouse_shk(shkp,'\0');
    iVar5 = inhishop(shkp);
    if (iVar5 == 0) {
      home_shk(shkp,'\0');
    }
  }
  setpaid(shkp);
  return bVar13;
}

Assistant:

static boolean inherits(struct monst *shkp, int numsk, int croaked)
{
	long loss = 0L;
	long umoney;
	struct eshk *eshkp = ESHK(shkp);
	boolean take = FALSE, taken = FALSE;
	int roomno = *u.ushops;
	char takes[BUFSZ];

	/* the simplifying principle is that first-come */
	/* already took everything you had.		*/
	if (numsk > 1) {
	    if (cansee(shkp->mx, shkp->my) && croaked)
		pline("%s %slooks at your corpse%s and %s.",
		      Monnam(shkp),
		      (!shkp->mcanmove || shkp->msleeping) ? "wakes up, " : "",
		      !rn2(2) ? (shkp->female ? ", shakes her head," :
			   ", shakes his head,") : "",
		      !inhishop(shkp) ? "disappears" : "sighs");
	    rouse_shk(shkp, FALSE);	/* wake shk for bones */
	    taken = (roomno == eshkp->shoproom);
	    goto skip;
	}

	/* get one case out of the way: you die in the shop, the */
	/* shopkeeper is peaceful, nothing stolen, nothing owed. */
	if (roomno == eshkp->shoproom && inhishop(shkp) &&
	    !eshkp->billct && !eshkp->robbed && !eshkp->debit &&
	     NOTANGRY(shkp) && !eshkp->following) {
		if (invent)
			pline("%s gratefully inherits all your possessions.",
				shkname(shkp));
		set_repo_loc(eshkp);
		goto clear;
	}

	if (eshkp->billct || eshkp->debit || eshkp->robbed) {
		if (roomno == eshkp->shoproom && inhishop(shkp))
		    loss = addupbill(shkp) + eshkp->debit;
		if (loss < eshkp->robbed) loss = eshkp->robbed;
		take = TRUE;
	}

	if (eshkp->following || ANGRY(shkp) || take) {
		if (!invent) goto skip;
                umoney = money_cnt(invent);
		takes[0] = '\0';
		if (!shkp->mcanmove || shkp->msleeping)
			strcat(takes, "wakes up and ");
		if (distu(shkp->mx, shkp->my) > 2)
			strcat(takes, "comes and ");
		strcat(takes, "takes");

		if (loss > umoney || !loss || roomno == eshkp->shoproom) {
			eshkp->robbed -= umoney;
			if (eshkp->robbed < 0L) eshkp->robbed = 0L;
                        if (umoney > 0) money2mon(shkp, umoney);
			iflags.botl = 1;
			pline("%s %s all your possessions.",
			      shkname(shkp), takes);
			taken = TRUE;
			/* where to put player's invent (after disclosure) */
			set_repo_loc(eshkp);
		} else {
                        money2mon(shkp, loss);
			iflags.botl = 1;
			pline("%s %s the %ld %s %sowed %s.",
			      Monnam(shkp), takes,
			      loss, currency(loss),
			      strncmp(eshkp->customer, plname, PL_NSIZ) ?
					"" : "you ",
			      shkp->female ? "her" : "him");
			/* shopkeeper has now been paid in full */
			pacify_shk(shkp);
			eshkp->following = 0;
			eshkp->robbed = 0L;
		}
skip:
		/* in case we create bones */
		rouse_shk(shkp, FALSE);	/* wake up */
		if (!inhishop(shkp))
			home_shk(shkp, FALSE);
	}
clear:
	setpaid(shkp);
	return taken;
}